

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O1

string * __thiscall
OpenMD::Revision::getRevision_abi_cxx11_(string *__return_storage_ptr__,Revision *this)

{
  string rev;
  size_type __dnew;
  ulong *local_48;
  ulong local_40;
  ulong local_38 [2];
  ulong local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_28 = 0x28;
  local_48 = local_38;
  local_48 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_28);
  local_38[0] = local_28;
  local_48[2] = 0x3165663662313366;
  local_48[3] = 0x3263356238653430;
  *local_48 = 0x6665616635393662;
  local_48[1] = 0x3034336435646533;
  local_48[4] = 0x3466316130623336;
  local_40 = local_28;
  *(char *)((long)local_48 + local_28) = '\0';
  std::__cxx11::string::_M_replace_aux((ulong)&local_48,local_28,0,'(' - (char)local_28);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_40 == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Revision::getRevision() {
    std::string r;
    std::string rev(revision, strnlen(revision, 40));
    rev.append(40 - rev.length(), ' ');
    r.append("Revision: ");
    // If there's no GIT SHA1 revision, just call this the RELEASE revision.
    if (!rev.empty()) {
      r.append(rev);
    } else {
      r.append("RELEASE");
    }
    return r;
  }